

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compare.cpp
# Opt level: O3

void __thiscall Compare::Run(Compare *this,int n,double density)

{
  KDefectiveBase *this_00;
  KDefectiveSimple *this_01;
  KDefectiveRDS *this_02;
  
  this_00 = (KDefectiveBase *)operator_new(0xb8);
  KDefectiveBase::KDefectiveBase(this_00,n);
  this_00->_vptr_KDefectiveBase = (_func_int **)&PTR___init___00129440;
  this->solverBase = (BitSetImplement<std::bitset<128UL>,_KDefectiveBase> *)this_00;
  this_01 = (KDefectiveSimple *)operator_new(0xb8);
  KDefectiveSimple::KDefectiveSimple(this_01,n);
  (this_01->super_KDefectiveBase)._vptr_KDefectiveBase = (_func_int **)&PTR___init___001295b8;
  this->solverSimple = (BitSetImplement<std::bitset<128UL>,_KDefectiveSimple> *)this_01;
  this_02 = (KDefectiveRDS *)operator_new(0xd8);
  KDefectiveRDS::KDefectiveRDS(this_02,n);
  (this_02->super_KDefectiveBase)._vptr_KDefectiveBase = (_func_int **)&PTR___init___00129730;
  this->solverRDS = (BitSetImplement<std::bitset<128UL>,_KDefectiveRDS> *)this_02;
  GraphGenerator::Generate(&this->super_GraphGenerator,n,density,0.0001);
  buildGraphInSolver(this);
  run(this,n);
  if (this->solverBase != (BitSetImplement<std::bitset<128UL>,_KDefectiveBase> *)0x0) {
    (*(this->solverBase->super_KDefectiveBase)._vptr_KDefectiveBase[0x1e])();
  }
  if (this->solverSimple != (BitSetImplement<std::bitset<128UL>,_KDefectiveSimple> *)0x0) {
    (*(this->solverSimple->super_KDefectiveSimple).super_KDefectiveBase._vptr_KDefectiveBase[0x1e])
              ();
  }
  if (this->solverRDS != (BitSetImplement<std::bitset<128UL>,_KDefectiveRDS> *)0x0) {
    (*(this->solverRDS->super_KDefectiveRDS).super_KDefectiveBase._vptr_KDefectiveBase[0x1e])();
    return;
  }
  return;
}

Assistant:

void Compare::Run(int n, double density) {
	solverBase = new BitSetImplement<bitset<128>, KDefectiveBase>(n);
	solverSimple = new BitSetImplement<bitset<128>, KDefectiveSimple>(n);
	solverRDS = new BitSetImplement<bitset<128>, KDefectiveRDS>(n);

	this -> Generate(n, density, 0.0001);
	this -> buildGraphInSolver();
	this -> run(n);

	delete solverBase;
	delete solverSimple;
	delete solverRDS;
}